

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

void ps_builder_close_contour(PS_Builder *builder)

{
  ushort uVar1;
  FT_Face pFVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (builder == (PS_Builder *)0x0) {
    return;
  }
  uVar1 = *(ushort *)&builder->memory;
  if ((short)uVar1 < 2) {
    uVar5 = 0;
    if (uVar1 == 0) {
      uVar4 = (uint)*(ushort *)((long)&builder->memory + 2);
      uVar5 = 0;
      goto LAB_0020b362;
    }
  }
  else {
    uVar5 = (int)*(short *)((long)&builder->loader->memory + (ulong)((int)(short)uVar1 - 2) * 2) + 1
    ;
  }
  uVar4 = (uint)*(short *)((long)&builder->memory + 2);
  if (uVar5 == uVar4) {
    *(ushort *)&builder->memory = uVar1 - 1;
    return;
  }
LAB_0020b362:
  sVar3 = (short)uVar4;
  if (1 < sVar3) {
    pFVar2 = builder->face;
    uVar6 = (ulong)((uVar4 & 0xffff) << 4);
    if ((((&pFVar2->num_faces)[(long)(int)uVar5 * 2] == *(long *)((long)pFVar2 + (uVar6 - 0x10))) &&
        ((&pFVar2->face_index)[(long)(int)uVar5 * 2] == *(long *)((long)pFVar2 + (uVar6 - 8)))) &&
       (*(char *)((long)builder->glyph + ((ulong)(uVar4 & 0xffff) - 1)) == '\x01')) {
      sVar3 = sVar3 + -1;
      *(short *)((long)&builder->memory + 2) = sVar3;
    }
  }
  if (0 < (short)uVar1) {
    if (uVar5 == (int)sVar3 - 1U) {
      *(ushort *)&builder->memory = uVar1 - 1;
      *(short *)((long)&builder->memory + 2) = sVar3 + -1;
    }
    else {
      *(short *)((long)builder->loader + (ulong)uVar1 * 2 + -2) = (short)((int)sVar3 - 1U);
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_builder_close_contour( PS_Builder*  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Int       first;


    if ( !outline )
      return;

    first = outline->n_contours <= 1
            ? 0 : outline->contours[outline->n_contours - 2] + 1;

    /* in malformed fonts it can happen that a contour was started */
    /* but no points were added                                    */
    if ( outline->n_contours && first == outline->n_points )
    {
      outline->n_contours--;
      return;
    }

    /* We must not include the last point in the path if it */
    /* is located on the first point.                       */
    if ( outline->n_points > 1 )
    {
      FT_Vector*  p1      = outline->points + first;
      FT_Vector*  p2      = outline->points + outline->n_points - 1;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points - 1;


      /* `delete' last point only if it coincides with the first */
      /* point and it is not a control point (which can happen). */
      if ( p1->x == p2->x && p1->y == p2->y )
        if ( *control == FT_CURVE_TAG_ON )
          outline->n_points--;
    }

    if ( outline->n_contours > 0 )
    {
      /* Don't add contours only consisting of one point, i.e.,  */
      /* check whether the first and the last point is the same. */
      if ( first == outline->n_points - 1 )
      {
        outline->n_contours--;
        outline->n_points--;
      }
      else
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );
    }
  }